

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  uint uVar2;
  scoped_padder p;
  scoped_padder sStack_58;
  format_int local_30;
  
  uVar1 = (msg->source).line;
  if ((long)(int)uVar1 < 1) {
    scoped_padder::scoped_padder(&sStack_58,0,&(this->super_flag_formatter).padinfo_,dest);
  }
  else {
    uVar2 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    scoped_padder::scoped_padder
              (&sStack_58,
               (ulong)((long)(int)uVar1 +
                      *(long *)(fmt::v10::detail::do_count_digits(unsigned_int)::table +
                               (ulong)uVar2 * 8)) >> 0x20,&(this->super_flag_formatter).padinfo_,
               dest);
    local_30.str_ = fmt::v10::format_int::format_signed<int>(&local_30,(msg->source).line);
    fmt::v10::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_30.str_,local_30.buffer_ + 0x15);
  }
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        auto field_size = ScopedPadder::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }